

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O3

size_t count_textures(aiScene *scene)

{
  aiMaterial *pMat;
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  
  if (scene->mNumMaterials == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    uVar3 = 0;
    do {
      pMat = scene->mMaterials[uVar3];
      lVar4 = -0x11;
      do {
        uVar1 = aiGetMaterialTextureCount(pMat,(int)lVar4 + aiTextureType_UNKNOWN);
        sVar2 = (sVar2 + 1) - (ulong)(uVar1 == 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
      uVar3 = uVar3 + 1;
    } while (uVar3 < scene->mNumMaterials);
  }
  return sVar2;
}

Assistant:

size_t count_textures(const aiScene* scene) {
    size_t count = 0;
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        for (
            size_t tt = aiTextureType_DIFFUSE;
            tt < aiTextureType_UNKNOWN;
            ++tt
        ){
            // TODO: handle layered textures
            if (mat->GetTextureCount(static_cast<aiTextureType>(tt)) > 0) {
                count += 1;
            }
        }
    }
    return count;
}